

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_index_t pos)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  JSONNode *ptr;
  out_of_range *this_00;
  string *psVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,pos);
  piVar2 = (internalJSONNode *)*puVar4;
  if (0xfd < (byte)(piVar2->_type - 6)) {
    internalJSONNode::Fetch(piVar2);
    if (in_EDX < piVar2->Children->mysize) {
      piVar2 = (internalJSONNode *)*puVar4;
      if (1 < piVar2->refcount) {
        piVar2->refcount = piVar2->refcount - 1;
        piVar2 = internalJSONNode::newInternal(piVar2);
      }
      *puVar4 = piVar2;
      ptr = internalJSONNode::pop_back(piVar2,in_EDX);
      piVar2 = ptr->internal;
      psVar1 = &piVar2->refcount;
      *psVar1 = *psVar1 + 1;
      this->internal = piVar2;
      deleteJSONNode(ptr);
      return (JSONNode)(internalJSONNode *)this;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("pop_back out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    makeUniqueInternal();
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(pos);
    #else
	   auto_delete temp(internal -> pop_back(pos));
	   return *temp.mynode;
    #endif
}